

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

string * __thiscall
MapLoader::getFilePath_abi_cxx11_(string *__return_storage_ptr__,MapLoader *this)

{
  MapLoader *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->filePath);
  return __return_storage_ptr__;
}

Assistant:

string MapLoader::getFilePath()
{
  //method to get the filepath of the map
  return filePath;
}